

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O0

void predict_or_learn_adaptive<true>(boosting *o,single_learner *base,example *ec)

{
  float fVar1;
  EVP_PKEY_CTX *pEVar2;
  reference pvVar3;
  EVP_PKEY_CTX *in_RDX;
  size_t *extraout_RDX;
  size_t *siglen;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *sig;
  int *in_RDI;
  EVP_PKEY_CTX *ctx;
  size_t in_R8;
  float fVar4;
  float fVar5;
  undefined4 extraout_XMM0_Da;
  double dVar6;
  int i_1;
  float z;
  float w;
  int i;
  float stopping_point;
  float eta;
  float u;
  float v_partial_sum;
  float v_normalization;
  float s;
  float partial_prediction;
  float final_prediction;
  label_data *ld;
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar7;
  float in_stack_ffffffffffffffb4;
  int local_44;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  
  pEVar2 = in_RDX + 0x6828;
  local_24 = 0.0;
  local_28 = 0.0;
  local_2c = 0.0;
  local_30 = 0.0;
  local_34 = 0.0;
  fVar1 = *(float *)(in_RDX + 0x6870);
  in_RDI[0x1e] = in_RDI[0x1e] + 1;
  sig = in_RSI;
  fVar4 = sqrtf((float)in_RDI[0x1e]);
  ctx = (EVP_PKEY_CTX *)(*(long *)(in_RDI + 10) + 0x3448);
  fVar5 = merand48((uint64_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  siglen = extraout_RDX;
  for (local_44 = 0; local_44 < *in_RDI; local_44 = local_44 + 1) {
    dVar6 = std::exp((double)(ulong)(uint)local_2c);
    *(float *)(in_RDX + 0x6870) = fVar1 * (1.0 / (SUB84(dVar6,0) + 1.0));
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (example *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    in_stack_ffffffffffffffac = *(float *)pEVar2 * *(float *)(in_RDX + 0x6850);
    in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffac;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x12),(long)local_44);
    local_2c = in_stack_ffffffffffffffac * *pvVar3 + local_2c;
    if (local_34 <= fVar5) {
      in_stack_ffffffffffffffa8 = *(float *)(in_RDX + 0x6850);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x12),(long)local_44);
      local_24 = in_stack_ffffffffffffffa8 * *pvVar3 + local_24;
    }
    in_stack_ffffffffffffffa4 = *(float *)(in_RDX + 0x6850);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x12),(long)local_44);
    local_28 = in_stack_ffffffffffffffa4 * *pvVar3 + local_28;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x18),(long)local_44);
    local_34 = *pvVar3 + local_34;
    if (*(float *)pEVar2 * local_28 < 0.0) {
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x18),(long)local_44);
      *pvVar3 = *pvVar3 * 0.36788;
    }
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x18),(long)local_44);
    local_30 = *pvVar3 + local_30;
    in_stack_ffffffffffffffa0 = (4.0 / fVar4) * in_stack_ffffffffffffffb4;
    dVar6 = std::exp((double)(ulong)(uint)local_2c);
    in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 / (SUB84(dVar6,0) + 1.0);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x12),(long)local_44);
    *pvVar3 = in_stack_ffffffffffffffa0 + *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x12),(long)local_44);
    if (2.0 < *pvVar3) {
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x12),(long)local_44);
      *pvVar3 = 2.0;
    }
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x12),(long)local_44);
    if (*pvVar3 < -2.0) {
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x12),(long)local_44);
      *pvVar3 = -2.0;
    }
    sig = in_RDX;
    ctx = in_RSI;
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (example *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    siglen = extraout_RDX_00;
  }
  for (iVar7 = 0; iVar7 < *in_RDI; iVar7 = iVar7 + 1) {
    if ((local_30 != 0.0) || (NAN(local_30))) {
      ctx = (EVP_PKEY_CTX *)(in_RDI + 0x18);
      sig = (EVP_PKEY_CTX *)(long)iVar7;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)ctx,(size_type)sig);
      *pvVar3 = *pvVar3 / local_30;
      siglen = extraout_RDX_01;
    }
  }
  *(float *)(in_RDX + 0x6870) = fVar1;
  *(float *)(in_RDX + 0x68a8) = local_24;
  sign(ctx,(uchar *)sig,siglen,(uchar *)in_RDI,in_R8);
  *(undefined4 *)(in_RDX + 0x6850) = extraout_XMM0_Da;
  if ((*(float *)pEVar2 != *(float *)(in_RDX + 0x6850)) ||
     (NAN(*(float *)pEVar2) || NAN(*(float *)(in_RDX + 0x6850)))) {
    *(undefined4 *)(in_RDX + 0x68b0) = *(undefined4 *)(in_RDX + 0x6870);
  }
  else {
    *(undefined4 *)(in_RDX + 0x68b0) = 0;
  }
  return;
}

Assistant:

void predict_or_learn_adaptive(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0, partial_prediction = 0;

  float s = 0;
  float v_normalization = 0, v_partial_sum = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / (float)sqrtf((float)o.t);

  float stopping_point = merand48(o.all->random_state);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;

      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }

      partial_prediction += ec.pred.scalar * o.alpha[i];

      v_partial_sum += o.v[i];

      // update v, exp(-1) = 0.36788
      if (ld.label * partial_prediction < 0)
      {
        o.v[i] *= 0.36788f;
      }
      v_normalization += o.v[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }
      else
      {
        // stopping at learner i
        break;
      }
      v_partial_sum += o.v[i];
    }
  }

  // normalize v vector in training
  if (is_learn)
  {
    for (int i = 0; i < o.N; i++)
    {
      if (v_normalization)
        o.v[i] /= v_normalization;
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}